

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  ConfigData *in_RDI;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unaff_retaddr;
  
  cleanUp();
  Ptr<Catch::Config>::~Ptr((Ptr<Catch::Config> *)in_RDI);
  ConfigData::~ConfigData(in_RDI);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(unaff_retaddr);
  Clara::CommandLine<Catch::ConfigData>::~CommandLine((CommandLine<Catch::ConfigData> *)in_RDI);
  return;
}

Assistant:

~Session() {
            Catch::cleanUp();
        }